

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Entry;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  iVar9 = LimitMax * 2;
  pVVar4 = Vec_IntAlloc(iVar9);
  p_00 = Vec_IntAlloc(iVar9);
  p_01 = Vec_IntAlloc(iVar9);
  p_02 = Vec_WecAlloc(1000);
  Gia_ManCreateRefs(p);
  for (iVar9 = 0; iVar9 < p->nObjs; iVar9 = iVar9 + 1) {
    pObj = Gia_ManObj(p,iVar9);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iVar1 = Gia_ObjId(p,pObj);
      if (p->pRefs[iVar1] != 0) {
        pVVar4->nSize = 0;
        pGVar5 = pObj;
        iVar1 = Gia_ObjCheckMffc_rec(p,pObj,LimitMax,pVVar4);
        if (iVar1 != 0) {
          p_00->nSize = 0;
          p_01->nSize = 0;
          Vec_IntSort(pVVar4,(int)pGVar5);
          for (iVar8 = 0; iVar8 < pVVar4->nSize; iVar8 = iVar8 + 1) {
            iVar2 = Vec_IntEntry(pVVar4,iVar8);
            if (p->pRefs[iVar2] < 1) {
              pGVar5 = Gia_ManObj(p,iVar2);
              if ((~*(uint *)pGVar5 & 0x9fffffff) == 0) goto LAB_005e759d;
              pVVar6 = p_01;
              if (p_01->nSize != 0) {
                iVar3 = Vec_IntEntryLast(p_01);
                goto LAB_005e75b1;
              }
LAB_005e75b6:
              Vec_IntPush(pVVar6,iVar2);
            }
            else {
LAB_005e759d:
              pVVar6 = p_00;
              if (p_00->nSize == 0) goto LAB_005e75b6;
              iVar3 = Vec_IntEntryLast(p_00);
LAB_005e75b1:
              if (iVar3 != iVar2) goto LAB_005e75b6;
            }
          }
          iVar8 = Gia_ObjId(p,pObj);
          Vec_IntPush(p_01,iVar8);
        }
        for (iVar8 = 0; iVar8 < pVVar4->nSize; iVar8 = iVar8 + 1) {
          iVar2 = Vec_IntEntry(pVVar4,iVar8);
          p->pRefs[iVar2] = p->pRefs[iVar2] + 1;
        }
        if (iVar1 != 0) {
          iVar1 = p_01->nSize;
          if ((LimitMin <= iVar1) && (iVar8 = p_00->nSize, iVar8 <= SuppMax)) {
            iVar2 = p_02->nSize;
            if (iVar2 == p_02->nCap) {
              uVar10 = iVar2 * 2;
              if (iVar2 < 0x10) {
                uVar10 = 0x10;
              }
              if (iVar2 < (int)uVar10) {
                if (p_02->pArray == (Vec_Int_t *)0x0) {
                  pVVar6 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
                }
                else {
                  pVVar6 = (Vec_Int_t *)realloc(p_02->pArray,(ulong)uVar10 << 4);
                }
                p_02->pArray = pVVar6;
                memset(pVVar6 + iVar2,0,(long)(int)(uVar10 - iVar2) << 4);
                p_02->nCap = uVar10;
              }
            }
            p_02->nSize = iVar2 + 1U;
            if (iVar2 < 0) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                            ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            pVVar6 = p_02->pArray + ((ulong)(iVar2 + 1U) - 1);
            Vec_IntGrow(pVVar6,iVar1 + iVar8 + 0x14);
            Vec_IntPush(pVVar6,iVar9);
            Vec_IntPush(pVVar6,iVar8);
            Vec_IntPush(pVVar6,iVar1);
            iVar2 = 0;
            iVar3 = 0;
            if (0 < iVar8) {
              iVar2 = 0;
              iVar3 = iVar8;
            }
            for (; iVar3 != iVar2; iVar2 = iVar2 + 1) {
              Entry = Vec_IntEntry(p_00,iVar2);
              Vec_IntPush(pVVar6,Entry);
            }
            Vec_IntPush(pVVar6,(iVar1 * 1000) / iVar8);
          }
        }
      }
    }
  }
  Vec_IntFree(pVVar4);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  iVar9 = p_02->nSize;
  qsort(p_02->pArray,(long)iVar9,0x10,Vec_WecSortCompare6);
  iVar1 = 0;
  iVar8 = 0;
  if (0 < iVar9) {
    iVar1 = iVar9;
    iVar8 = 0;
  }
  for (; iVar1 != iVar8; iVar8 = iVar8 + 1) {
    pVVar4 = Vec_WecEntry(p_02,iVar8);
    if (pVVar4->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
    }
    pVVar4->nSize = pVVar4->nSize + -1;
  }
  uVar7 = (long)(RatioBest * iVar9) / 100;
  iVar1 = (int)uVar7;
  uVar7 = uVar7 & 0xffffffff;
  while (iVar8 = (int)uVar7, iVar8 < iVar9) {
    pVVar4 = Vec_WecEntry(p_02,iVar8);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    pVVar4->nCap = 0;
    pVVar4->nSize = 0;
    uVar7 = (ulong)(iVar8 + 1);
  }
  if (iVar1 <= iVar9) {
    p_02->nSize = iVar1;
    return p_02;
  }
  __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaResub.c"
                ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}